

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fl_vertex.cxx
# Opt level: O2

void __thiscall
Fl_Graphics_Driver::transformed_vertex0(Fl_Graphics_Driver *this,COORD_T x,COORD_T y)

{
  XPoint *__ptr;
  int iVar1;
  long lVar2;
  
  iVar1 = this->n;
  lVar2 = (long)iVar1;
  if (((lVar2 == 0) || (this->p[lVar2 + -1].x != x)) || (this->p[lVar2 + -1].y != y)) {
    __ptr = this->p;
    if (this->p_size <= iVar1) {
      iVar1 = 0x10;
      if (__ptr != (XPoint *)0x0) {
        iVar1 = this->p_size * 2;
      }
      this->p_size = iVar1;
      __ptr = (XPoint *)realloc(__ptr,(long)iVar1 << 2);
      this->p = __ptr;
      iVar1 = this->n;
    }
    __ptr[iVar1].x = x;
    __ptr[iVar1].y = y;
    this->n = iVar1 + 1;
  }
  return;
}

Assistant:

void Fl_Graphics_Driver::transformed_vertex0(COORD_T x, COORD_T y) {
  if (!n || x != p[n-1].x || y != p[n-1].y) {
    if (n >= p_size) {
      p_size = p ? 2*p_size : 16;
      p = (XPOINT*)realloc((void*)p, p_size*sizeof(*p));
    }
    p[n].x = x;
    p[n].y = y;
    n++;
  }
}